

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

uint crnlib::dxt5_block::get_block_values6(uint *pDst,uint l,uint h)

{
  *pDst = l;
  pDst[1] = h;
  pDst[2] = (h + l * 4) / 5;
  pDst[3] = (l * 3 + h * 2) / 5;
  pDst[4] = (h * 3 + l * 2) / 5;
  pDst[5] = (l + h * 4) / 5;
  pDst[6] = 0;
  pDst[7] = 0xff;
  return 6;
}

Assistant:

uint dxt5_block::get_block_values6(uint* pDst, uint l, uint h) {
  pDst[0] = l;
  pDst[1] = h;
  pDst[2] = (l * 4 + h) / 5;
  pDst[3] = (l * 3 + h * 2) / 5;
  pDst[4] = (l * 2 + h * 3) / 5;
  pDst[5] = (l + h * 4) / 5;
  pDst[6] = 0;
  pDst[7] = 255;
  return 6;
}